

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_transaction.cpp
# Opt level: O3

int CfdCreateSighash(void *handle,int net_type,char *tx_hex_string,char *txid,uint32_t vout,
                    int hash_type,char *pubkey,char *redeem_script,int64_t value_satoshi,
                    int sighash_type,bool sighash_anyone_can_pay,char **sighash)

{
  byte bVar1;
  byte bVar2;
  bool bVar3;
  AddressType AVar4;
  char *pcVar5;
  CfdException *pCVar6;
  WitnessVersion version;
  ByteData sighash_bytes;
  SigHashType sighashtype;
  Amount value;
  TransactionContext tx;
  allocator local_257;
  allocator local_256;
  bool local_255;
  uint32_t local_254;
  Pubkey local_250;
  OutPoint local_238;
  string local_210;
  undefined1 local_1f0 [56];
  string local_1b8;
  string local_198;
  void *local_178;
  ByteData local_170;
  SigHashType local_154;
  Amount local_148;
  undefined1 local_138 [216];
  SigHashType local_60;
  SigHashType local_54;
  SigHashType local_48;
  SigHashType local_3c;
  
  local_254 = vout;
  local_178 = handle;
  cfd::Initialize();
  bVar3 = cfd::capi::IsEmptyString(tx_hex_string);
  if (bVar3) {
    local_138._0_8_ = "cfdcapi_transaction.cpp";
    local_138._8_4_ = 0x922;
    local_138._16_8_ = "CfdCreateSighash";
    cfd::core::logger::log<>
              ((CfdSourceLocation *)local_138,kCfdLogLevelWarning,"tx is null or empty.");
    pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
    local_138._0_8_ = local_138 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_138,"Failed to parameter. tx is null or empty.","");
    cfd::core::CfdException::CfdException(pCVar6,kCfdIllegalArgumentError,(string *)local_138);
    __cxa_throw(pCVar6,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  bVar3 = cfd::capi::IsEmptyString(txid);
  if (bVar3) {
    local_138._0_8_ = "cfdcapi_transaction.cpp";
    local_138._8_4_ = 0x928;
    local_138._16_8_ = "CfdCreateSighash";
    cfd::core::logger::log<>
              ((CfdSourceLocation *)local_138,kCfdLogLevelWarning,"txid is null or empty.");
    pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
    local_138._0_8_ = local_138 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_138,"Failed to parameter. txid is null or empty.","");
    cfd::core::CfdException::CfdException(pCVar6,kCfdIllegalArgumentError,(string *)local_138);
    __cxa_throw(pCVar6,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if (sighash == (char **)0x0) {
    local_138._0_8_ = "cfdcapi_transaction.cpp";
    local_138._8_4_ = 0x92e;
    local_138._16_8_ = "CfdCreateSighash";
    cfd::core::logger::log<>((CfdSourceLocation *)local_138,kCfdLogLevelWarning,"sighash is null.");
    pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
    local_138._0_8_ = local_138 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_138,"Failed to parameter. sighash is null.","");
    cfd::core::CfdException::CfdException(pCVar6,kCfdIllegalArgumentError,(string *)local_138);
    __cxa_throw(pCVar6,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  AVar4 = cfd::capi::ConvertHashToAddressType(0);
  version = kVersionNone;
  switch(AVar4) {
  case kP2shAddress:
    bVar2 = 1;
    break;
  case kP2pkhAddress:
    bVar2 = 0;
    break;
  case kP2wshAddress:
  case kP2shP2wshAddress:
    bVar1 = 1;
    goto LAB_004689eb;
  case kP2wpkhAddress:
  case kP2shP2wpkhAddress:
    bVar1 = 0;
LAB_004689eb:
    bVar2 = 0;
    version = kVersion0;
    goto LAB_004689f8;
  default:
    local_138._0_8_ = "cfdcapi_transaction.cpp";
    local_138._8_4_ = 0x94b;
    local_138._16_8_ = "CfdCreateSighash";
    cfd::core::logger::log<>
              ((CfdSourceLocation *)local_138,kCfdLogLevelWarning,"hashtype is illegal.");
    pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
    local_138._0_8_ = local_138 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_138,"Failed to parameter. hashtype is illegal.","");
    cfd::core::CfdException::CfdException(pCVar6,kCfdIllegalArgumentError,(string *)local_138);
    __cxa_throw(pCVar6,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  bVar1 = 0;
LAB_004689f8:
  local_255 = false;
  cfd::capi::ConvertNetType(net_type,&local_255);
  cfd::core::Amount::Amount(&local_148,value_satoshi);
  cfd::core::ByteData::ByteData(&local_170);
  cfd::core::SigHashType::Create(&local_154,(uint8_t)sighash_type,sighash_anyone_can_pay,false);
  if ((bool)(bVar2 | bVar1)) {
    bVar3 = cfd::capi::IsEmptyString(redeem_script);
    if (bVar3) {
      local_138._0_8_ = "cfdcapi_transaction.cpp";
      local_138._8_4_ = 0x95a;
      local_138._16_8_ = "CfdCreateSighash";
      cfd::core::logger::log<>
                ((CfdSourceLocation *)local_138,kCfdLogLevelWarning,
                 "redeem script is null or empty.");
      pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
      local_138._0_8_ = local_138 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_138,"Failed to parameter. redeem script is null or empty.","");
      cfd::core::CfdException::CfdException(pCVar6,kCfdIllegalArgumentError,(string *)local_138);
      __cxa_throw(pCVar6,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
    }
    if (local_255 != true) {
      std::__cxx11::string::string((string *)local_1f0,tx_hex_string,(allocator *)&local_238);
      cfd::ConfidentialTransactionContext::ConfidentialTransactionContext
                ((ConfidentialTransactionContext *)local_138,(string *)local_1f0);
      if ((undefined1 *)local_1f0._0_8_ != local_1f0 + 0x10) {
        operator_delete((void *)local_1f0._0_8_,local_1f0._16_8_ + 1);
      }
      std::__cxx11::string::string((string *)&local_198,txid,&local_256);
      cfd::core::Txid::Txid((Txid *)&local_210,&local_198);
      cfd::core::OutPoint::OutPoint(&local_238,(Txid *)&local_210,local_254);
      std::__cxx11::string::string((string *)&local_1b8,redeem_script,&local_257);
      cfd::core::Script::Script((Script *)local_1f0,&local_1b8);
      cfd::core::SigHashType::SigHashType(&local_48,&local_154);
      cfd::ConfidentialTransactionContext::CreateSignatureHash
                (&local_250.data_,(ConfidentialTransactionContext *)local_138,&local_238,
                 (Script *)local_1f0,&local_48,&local_148,version);
      cfd::core::ByteData::operator=(&local_170,&local_250.data_);
      if (local_250.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_250.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_250.data_.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_250.data_.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      cfd::core::Script::~Script((Script *)local_1f0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
        operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
      }
      local_238.txid_._vptr_Txid = (_func_int **)&PTR__Txid_0086d9f8;
      if (local_238.txid_.data_.data_.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_238.txid_.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_238.txid_.data_.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_238.txid_.data_.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      local_210._M_dataplus._M_p = (pointer)&PTR__Txid_0086d9f8;
      if ((void *)local_210._M_string_length != (void *)0x0) {
        operator_delete((void *)local_210._M_string_length,
                        local_210.field_2._8_8_ - local_210._M_string_length);
      }
      local_210.field_2._M_allocated_capacity = local_198.field_2._M_allocated_capacity;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_198._M_dataplus._M_p != &local_198.field_2) {
LAB_0046914b:
        operator_delete(local_198._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
      }
LAB_00469153:
      cfd::ConfidentialTransactionContext::~ConfidentialTransactionContext
                ((ConfidentialTransactionContext *)local_138);
      goto LAB_00469160;
    }
    std::__cxx11::string::string((string *)local_1f0,tx_hex_string,(allocator *)&local_238);
    cfd::TransactionContext::TransactionContext((TransactionContext *)local_138,(string *)local_1f0)
    ;
    if ((undefined1 *)local_1f0._0_8_ != local_1f0 + 0x10) {
      operator_delete((void *)local_1f0._0_8_,local_1f0._16_8_ + 1);
    }
    std::__cxx11::string::string((string *)&local_198,txid,&local_256);
    cfd::core::Txid::Txid((Txid *)&local_210,&local_198);
    cfd::core::OutPoint::OutPoint(&local_238,(Txid *)&local_210,local_254);
    std::__cxx11::string::string((string *)&local_1b8,redeem_script,&local_257);
    cfd::core::Script::Script((Script *)local_1f0,&local_1b8);
    cfd::core::SigHashType::SigHashType(&local_3c,&local_154);
    cfd::TransactionContext::CreateSignatureHash
              (&local_250.data_,(TransactionContext *)local_138,&local_238,(Script *)local_1f0,
               &local_3c,&local_148,version);
    cfd::core::ByteData::operator=(&local_170,&local_250.data_);
    if (local_250.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_250.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_250.data_.data_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_250.data_.data_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    cfd::core::Script::~Script((Script *)local_1f0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
      operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
    }
    local_238.txid_._vptr_Txid = (_func_int **)&PTR__Txid_0086d9f8;
    if (local_238.txid_.data_.data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_238.txid_.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_238.txid_.data_.data_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_238.txid_.data_.data_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    local_210._M_dataplus._M_p = (pointer)&PTR__Txid_0086d9f8;
    if ((void *)local_210._M_string_length != (void *)0x0) {
      operator_delete((void *)local_210._M_string_length,
                      local_210.field_2._8_8_ - local_210._M_string_length);
    }
    local_210.field_2._M_allocated_capacity = local_198.field_2._M_allocated_capacity;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_198._M_dataplus._M_p != &local_198.field_2) {
LAB_00468de7:
      operator_delete(local_198._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    bVar3 = cfd::capi::IsEmptyString(pubkey);
    if (bVar3) {
      local_138._0_8_ = "cfdcapi_transaction.cpp";
      local_138._8_4_ = 0x971;
      local_138._16_8_ = "CfdCreateSighash";
      cfd::core::logger::log<>
                ((CfdSourceLocation *)local_138,kCfdLogLevelWarning,"pubkey is null or empty.");
      pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
      local_138._0_8_ = local_138 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_138,"Failed to parameter. pubkey is null or empty.","");
      cfd::core::CfdException::CfdException(pCVar6,kCfdIllegalArgumentError,(string *)local_138);
      __cxa_throw(pCVar6,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
    }
    if (local_255 != true) {
      std::__cxx11::string::string((string *)local_1f0,tx_hex_string,(allocator *)&local_238);
      cfd::ConfidentialTransactionContext::ConfidentialTransactionContext
                ((ConfidentialTransactionContext *)local_138,(string *)local_1f0);
      if ((undefined1 *)local_1f0._0_8_ != local_1f0 + 0x10) {
        operator_delete((void *)local_1f0._0_8_,local_1f0._16_8_ + 1);
      }
      std::__cxx11::string::string((string *)&local_210,txid,&local_256);
      cfd::core::Txid::Txid(&local_238.txid_,&local_210);
      cfd::core::OutPoint::OutPoint((OutPoint *)local_1f0,&local_238.txid_,local_254);
      std::__cxx11::string::string((string *)&local_198,pubkey,&local_257);
      cfd::core::Pubkey::Pubkey(&local_250,&local_198);
      cfd::core::SigHashType::SigHashType(&local_60,&local_154);
      cfd::ConfidentialTransactionContext::CreateSignatureHash
                ((ByteData *)&local_1b8,(ConfidentialTransactionContext *)local_138,
                 (OutPoint *)local_1f0,&local_250,&local_60,&local_148,version);
      cfd::core::ByteData::operator=(&local_170,(ByteData *)&local_1b8);
      if (local_1b8._M_dataplus._M_p != (pointer)0x0) {
        operator_delete(local_1b8._M_dataplus._M_p,
                        local_1b8.field_2._M_allocated_capacity - (long)local_1b8._M_dataplus._M_p);
      }
      if (local_250.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_250.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_250.data_.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_250.data_.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_198._M_dataplus._M_p != &local_198.field_2) {
        operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
      }
      local_1f0._0_8_ = &PTR__Txid_0086d9f8;
      if ((pointer)local_1f0._8_8_ != (pointer)0x0) {
        operator_delete((void *)local_1f0._8_8_,local_1f0._24_8_ - local_1f0._8_8_);
      }
      local_238.txid_._vptr_Txid = (_func_int **)&PTR__Txid_0086d9f8;
      if (local_238.txid_.data_.data_.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_238.txid_.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_238.txid_.data_.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_238.txid_.data_.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      local_198._M_dataplus._M_p = local_210._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_210._M_dataplus._M_p != &local_210.field_2) goto LAB_0046914b;
      goto LAB_00469153;
    }
    std::__cxx11::string::string((string *)local_1f0,tx_hex_string,(allocator *)&local_238);
    cfd::TransactionContext::TransactionContext((TransactionContext *)local_138,(string *)local_1f0)
    ;
    if ((undefined1 *)local_1f0._0_8_ != local_1f0 + 0x10) {
      operator_delete((void *)local_1f0._0_8_,local_1f0._16_8_ + 1);
    }
    std::__cxx11::string::string((string *)&local_210,txid,&local_256);
    cfd::core::Txid::Txid(&local_238.txid_,&local_210);
    cfd::core::OutPoint::OutPoint((OutPoint *)local_1f0,&local_238.txid_,local_254);
    std::__cxx11::string::string((string *)&local_198,pubkey,&local_257);
    cfd::core::Pubkey::Pubkey(&local_250,&local_198);
    cfd::core::SigHashType::SigHashType(&local_54,&local_154);
    cfd::TransactionContext::CreateSignatureHash
              ((ByteData *)&local_1b8,(TransactionContext *)local_138,(OutPoint *)local_1f0,
               &local_250,&local_54,&local_148,version);
    cfd::core::ByteData::operator=(&local_170,(ByteData *)&local_1b8);
    if (local_1b8._M_dataplus._M_p != (pointer)0x0) {
      operator_delete(local_1b8._M_dataplus._M_p,
                      local_1b8.field_2._M_allocated_capacity - (long)local_1b8._M_dataplus._M_p);
    }
    if (local_250.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_250.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_250.data_.data_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_250.data_.data_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_198._M_dataplus._M_p != &local_198.field_2) {
      operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
    }
    local_1f0._0_8_ = &PTR__Txid_0086d9f8;
    if ((pointer)local_1f0._8_8_ != (pointer)0x0) {
      operator_delete((void *)local_1f0._8_8_,local_1f0._24_8_ - local_1f0._8_8_);
    }
    local_238.txid_._vptr_Txid = (_func_int **)&PTR__Txid_0086d9f8;
    if (local_238.txid_.data_.data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_238.txid_.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_238.txid_.data_.data_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_238.txid_.data_.data_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    local_198._M_dataplus._M_p = local_210._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210._M_dataplus._M_p != &local_210.field_2) goto LAB_00468de7;
  }
  cfd::TransactionContext::~TransactionContext((TransactionContext *)local_138);
LAB_00469160:
  cfd::core::ByteData::GetHex_abi_cxx11_((string *)local_138,&local_170);
  pcVar5 = cfd::capi::CreateString((string *)local_138);
  *sighash = pcVar5;
  if ((undefined1 *)local_138._0_8_ != local_138 + 0x10) {
    operator_delete((void *)local_138._0_8_,(ulong)(local_138._16_8_ + 1));
  }
  if (local_170.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_170.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_170.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_170.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return 0;
}

Assistant:

int CfdCreateSighash(
    void* handle, int net_type, const char* tx_hex_string, const char* txid,
    uint32_t vout, int hash_type, const char* pubkey,
    const char* redeem_script, int64_t value_satoshi, int sighash_type,
    bool sighash_anyone_can_pay, char** sighash) {
  try {
    cfd::Initialize();
    if (IsEmptyString(tx_hex_string)) {
      warn(CFD_LOG_SOURCE, "tx is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. tx is null or empty.");
    }
    if (IsEmptyString(txid)) {
      warn(CFD_LOG_SOURCE, "txid is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. txid is null or empty.");
    }
    if (sighash == nullptr) {
      warn(CFD_LOG_SOURCE, "sighash is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. sighash is null.");
    }

    AddressType addr_type = ConvertHashToAddressType(hash_type);
    HashType core_hash_type;
    WitnessVersion version = WitnessVersion::kVersionNone;
    switch (addr_type) {
      case AddressType::kP2shAddress:
        core_hash_type = HashType::kP2sh;
        break;
      case AddressType::kP2wshAddress:
        // fall-through
      case AddressType::kP2shP2wshAddress:
        core_hash_type = HashType::kP2wsh;
        version = WitnessVersion::kVersion0;
        break;
      case AddressType::kP2pkhAddress:
        core_hash_type = HashType::kP2pkh;
        break;
      case AddressType::kP2wpkhAddress:
        // fall-through
      case AddressType::kP2shP2wpkhAddress:
        core_hash_type = HashType::kP2wpkh;
        version = WitnessVersion::kVersion0;
        break;
      default:
        warn(CFD_LOG_SOURCE, "hashtype is illegal.");
        throw CfdException(
            CfdError::kCfdIllegalArgumentError,
            "Failed to parameter. hashtype is illegal.");
    }

    bool is_bitcoin = false;
    ConvertNetType(net_type, &is_bitcoin);
    Amount value(value_satoshi);
    ByteData sighash_bytes;
    SigHashType sighashtype = SigHashType::Create(
        static_cast<uint8_t>(sighash_type), sighash_anyone_can_pay);
    if ((core_hash_type == HashType::kP2sh) ||
        (core_hash_type == HashType::kP2wsh)) {
      if (IsEmptyString(redeem_script)) {
        warn(CFD_LOG_SOURCE, "redeem script is null or empty.");
        throw CfdException(
            CfdError::kCfdIllegalArgumentError,
            "Failed to parameter. redeem script is null or empty.");
      }
      if (is_bitcoin) {
        TransactionContext tx(tx_hex_string);
        sighash_bytes = tx.CreateSignatureHash(
            OutPoint(Txid(std::string(txid)), vout), Script(redeem_script),
            sighashtype, value, version);
      } else {
#ifndef CFD_DISABLE_ELEMENTS
        ConfidentialTransactionContext tx(tx_hex_string);
        sighash_bytes = tx.CreateSignatureHash(
            OutPoint(Txid(std::string(txid)), vout), Script(redeem_script),
            sighashtype, value, version);
#else
        throw CfdException(
            CfdError::kCfdIllegalArgumentError, "Elements is not supported.");
#endif  // CFD_DISABLE_ELEMENTS
      }
    } else {
      if (IsEmptyString(pubkey)) {
        warn(CFD_LOG_SOURCE, "pubkey is null or empty.");
        throw CfdException(
            CfdError::kCfdIllegalArgumentError,
            "Failed to parameter. pubkey is null or empty.");
      }
      if (is_bitcoin) {
        TransactionContext tx(tx_hex_string);
        sighash_bytes = tx.CreateSignatureHash(
            OutPoint(Txid(std::string(txid)), vout), Pubkey(pubkey),
            sighashtype, value, version);
      } else {
#ifndef CFD_DISABLE_ELEMENTS
        ConfidentialTransactionContext tx(tx_hex_string);
        sighash_bytes = tx.CreateSignatureHash(
            OutPoint(Txid(std::string(txid)), vout), Pubkey(pubkey),
            sighashtype, value, version);
#else
        throw CfdException(
            CfdError::kCfdIllegalArgumentError, "Elements is not supported.");
#endif  // CFD_DISABLE_ELEMENTS
      }
    }

    *sighash = CreateString(sighash_bytes.GetHex());
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    return SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
    return CfdErrorCode::kCfdUnknownError;
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
    return CfdErrorCode::kCfdUnknownError;
  }
}